

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O1

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Graph_conflict *graph)

{
  vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  *this_00;
  pointer *ppSVar1;
  Index *pIVar2;
  pointer puVar3;
  pointer pvVar4;
  pointer puVar5;
  iterator iVar6;
  const_iterator __begin2;
  pointer pvVar7;
  ulong uVar8;
  Index extraout_var;
  fd_set *__writefds;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  fd_set *extraout_RDX_03;
  fd_set *pfVar9;
  long lVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer pSVar11;
  fd_set *__exceptfds;
  timeval *in_R9;
  ulong uVar12;
  Selector local_40;
  
  this->graph = graph;
  this_01 = &this->indegrees;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_01,((long)(graph->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(graph->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->buf,
             ((long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_40);
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar7 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pvVar4 - (long)pvVar7;
  if (lVar10 != 0) {
    this_00 = &this->selectors;
    puVar5 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      __exceptfds = (fd_set *)
                    (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
      for (pfVar9 = (fd_set *)
                    (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start; pfVar9 != __exceptfds;
          pfVar9 = (fd_set *)((long)pfVar9->fds_bits + 4)) {
        in_R9 = (timeval *)(ulong)(uint)pfVar9->fds_bits[0];
        puVar3 = puVar5 + (long)in_R9;
        *puVar3 = *puVar3 + 1;
      }
      pvVar7 = pvVar7 + 1;
    } while (pvVar7 != pvVar4);
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
    ::reserve(this_00,(lVar10 >> 3) * -0x5555555555555555);
    local_40.start = 0;
    local_40.count = 0;
    local_40.index = 0;
    iVar6._M_current =
         (this->selectors).
         super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->selectors).
        super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
      ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
                ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                  *)this_00,iVar6,&local_40);
      pfVar9 = extraout_RDX_00;
    }
    else {
      (iVar6._M_current)->index = 0;
      (iVar6._M_current)->start = 0;
      (iVar6._M_current)->count = 0;
      ppSVar1 = &(this->selectors).
                 super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
      pfVar9 = extraout_RDX;
    }
    if ((graph->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (graph->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      pSVar11 = (this->selectors).
                super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = 0;
      do {
        if ((this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar12] == 0) {
          pushChoice(this,(Index)uVar12);
          pIVar2 = &pSVar11[-1].count;
          *pIVar2 = *pIVar2 + 1;
          pfVar9 = extraout_RDX_01;
        }
        uVar12 = (ulong)((Index)uVar12 + 1);
        uVar8 = ((long)(graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
    }
    pSVar11 = (this->selectors).
              super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __writefds = (fd_set *)
                 (((long)(graph->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(graph->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if ((fd_set *)
        (((long)pSVar11 -
          (long)(this->selectors).
                super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) < __writefds)
    {
      do {
        local_40.start =
             Selector::select(pSVar11 + -1,(int)this,pfVar9,__writefds,__exceptfds,in_R9);
        local_40.count = extraout_var;
        local_40.index = (Index)extraout_RDX_02;
        iVar6._M_current =
             (this->selectors).
             super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->selectors).
            super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
          ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
                    ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                      *)this_00,iVar6,&local_40);
          pfVar9 = extraout_RDX_03;
        }
        else {
          (iVar6._M_current)->index = local_40.index;
          (iVar6._M_current)->start = local_40.start;
          (iVar6._M_current)->count = extraout_var;
          ppSVar1 = &(this->selectors).
                     super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
          pfVar9 = extraout_RDX_02;
        }
        pSVar11 = (this->selectors).
                  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __writefds = (fd_set *)
                     (((long)(graph->
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(graph->
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        ;
      } while ((fd_set *)
               (((long)pSVar11 -
                 (long)(this->selectors).
                       super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
               __writefds);
    }
    Selector::select(pSVar11 + -1,(int)this,pfVar9,__writefds,__exceptfds,in_R9);
  }
  return;
}

Assistant:

TopologicalOrdersImpl(const Graph& graph, Cmp cmp)
    : graph(graph), indegrees(graph.size()), buf(graph.size()), cmp(cmp) {
    if (graph.size() == 0) {
      return;
    }
    // Find the in-degree of each vertex.
    for (const auto& vertex : graph) {
      for (auto child : vertex) {
        ++indegrees[child];
      }
    }
    // Set up the first selector with its possible selections.
    selectors.reserve(graph.size());
    selectors.push_back({0, 0, 0});
    auto& first = selectors.back();
    for (Index i = 0; i < graph.size(); ++i) {
      if (indegrees[i] == 0) {
        if constexpr (useMinHeap) {
          pushChoice(i);
        } else {
          buf[first.count] = i;
        }
        ++first.count;
      }
    }
    // Initialize the full stack of selectors.
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }
    selectors.back().select(*this);
  }